

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevenshteinNFA.cpp
# Opt level: O3

void __thiscall
la::LevenshteinNFA::LevenshteinNFA
          (LevenshteinNFA *this,size_t size,int initialstate,
          list<int,_std::allocator<int>_> *finalStates)

{
  list<int,_std::allocator<int>_> *plVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  ulong in_RAX;
  undefined8 uStack_28;
  
  this->_initialState = initialstate;
  plVar1 = &this->_finalStates;
  p_Var2 = (finalStates->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  (this->_finalStates).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_next = p_Var2;
  p_Var3 = (finalStates->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
           super__List_node_base._M_prev;
  (this->_finalStates).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_prev = p_Var3;
  (this->_finalStates).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
       (finalStates->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size;
  if (p_Var2 == (_List_node_base *)finalStates) {
    (this->_finalStates).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)plVar1;
    (this->_finalStates).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)plVar1;
  }
  else {
    p_Var3->_M_next = (_List_node_base *)plVar1;
    ((plVar1->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.super__List_node_base.
    _M_next)->_M_prev = (_List_node_base *)plVar1;
    (finalStates->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.super__List_node_base
    ._M_prev = (_List_node_base *)finalStates;
    (finalStates->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.super__List_node_base
    ._M_next = (_List_node_base *)finalStates;
    (finalStates->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size = 0;
  }
  (this->_inputs).super__Fwd_list_base<char,_std::allocator<char>_>._M_impl._M_head._M_next =
       (_Fwd_list_node_base *)0x0;
  uStack_28 = in_RAX & 0xffffffffffffff;
  std::vector<char,_std::allocator<char>_>::vector
            (&this->_transTable,size * size,(value_type *)((long)&uStack_28 + 7),
             (allocator_type *)((long)&uStack_28 + 6));
  this->_size = size;
  return;
}

Assistant:

LevenshteinNFA::LevenshteinNFA(std::size_t size, int initialstate, std::list<int> &&finalStates)
        : _initialState{initialstate},
          _size{size},
          _finalStates{std::move(finalStates)},
          _transTable(size * size, '\0') {}